

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gkc.c
# Opt level: O3

uint64_t gkc_query(gkc_summary *s,double q)

{
  list *plVar1;
  list *plVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  plVar1 = (s->head).next;
  if (plVar1 == &s->head) {
    return 0;
  }
  dVar4 = ((double)CONCAT44(0x45300000,(int)(s->nr_elems >> 0x20)) - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)s->nr_elems) - 4503599627370496.0);
  dVar4 = (double)(int)(q * dVar4 + 0.5) + dVar4 * s->epsilon;
  dVar3 = 0.0;
  do {
    plVar2 = plVar1;
    plVar1 = plVar2->next;
    if (plVar1 == &s->head) goto LAB_00123b6b;
    dVar3 = dVar3 + (double)plVar2[-1].prev;
    dVar5 = (double)plVar1[-1].prev + dVar3;
  } while (((double)CONCAT44(0x45300000,(int)((ulong)plVar1[-1].next >> 0x20)) -
           1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)plVar1[-1].next) - 4503599627370496.0) + dVar5 <= dVar4
          );
  if (dVar5 <= dVar4) {
    plVar2 = plVar1;
  }
LAB_00123b6b:
  return (uint64_t)plVar2[-2].next;
}

Assistant:

uint64_t gkc_query(struct gkc_summary *s, double q)
{
    struct list *cur, *next;
    int rank;
    double gi;
    double ne;

    rank = 0.5 + q * s->nr_elems;
    ne = s->nr_elems * s->epsilon;
    gi = 0;
    if (list_empty(&s->head)) {
        return 0;
    }

    cur = s->head.next;

    while (1) {
        struct gkc_tuple *tcur, *tnext;

        tcur = list_to_tuple(cur);
        next = cur->next;
        if (next == &s->head) {
            return tcur->value;
        }
        tnext = list_to_tuple(next);

        gi += tcur->g;
        if ((rank + ne) < (gi + tnext->g + tnext->delta)) {
            if ((rank + ne) < (gi + tnext->g)) {
                return tcur->value;
            }
            return tnext->value;
        }
        cur = next;
    }
}